

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3_blob_open(sqlite3 *db,char *zDb,char *zTable,char *zColumn,sqlite_int64 iRow,int wrFlag,
                     sqlite3_blob **ppBlob)

{
  int iVar1;
  Schema *pSVar2;
  Schema *pSVar3;
  char *p;
  int iVar4;
  int iVar5;
  Incrblob *p_00;
  Table *pTVar6;
  Index *pIVar7;
  Vdbe *p_01;
  FKey *pFVar8;
  VdbeOp *pVVar9;
  long lVar10;
  Schema **ppSVar11;
  sqlite3 *psVar12;
  uint uVar13;
  char *pcVar14;
  uint uVar15;
  ulong uVar16;
  Column *pCVar17;
  char *zErr;
  Parse sParse;
  uint local_21c;
  char *local_218;
  Table *local_210;
  int local_208;
  uint local_204;
  sqlite3 *local_200;
  Incrblob *local_1f8;
  char *local_1f0;
  VdbeOp *local_1e8;
  sqlite_int64 local_1e0;
  char *local_1d8;
  char *local_1d0;
  Parse local_1c8;
  
  local_218 = (char *)0x0;
  *ppBlob = (sqlite3_blob *)0x0;
  local_208 = wrFlag;
  local_1f0 = zColumn;
  local_1e0 = iRow;
  local_1d8 = zDb;
  local_1d0 = zTable;
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  p_00 = (Incrblob *)sqlite3DbMallocZero(db,0x38);
  local_21c = 0;
  local_204 = 0;
  local_200 = db;
  local_1f8 = p_00;
  do {
    memset(&local_1c8,0,0x198);
    uVar13 = 0;
    if (p_00 == (Incrblob *)0x0) {
LAB_00127a9d:
      if ((uVar13 == 0) && (db->mallocFailed == '\0')) {
        *ppBlob = (sqlite3_blob *)p_00;
      }
      else if (p_00 != (Incrblob *)0x0) {
        if ((Vdbe *)p_00->pStmt != (Vdbe *)0x0) {
          sqlite3VdbeFinalize((Vdbe *)p_00->pStmt);
        }
        if (p_00 != (Incrblob *)0x0) {
          sqlite3DbFreeNN(db,p_00);
        }
      }
      p = local_218;
      pcVar14 = "%s";
      if (local_218 == (char *)0x0) {
        pcVar14 = (char *)0x0;
      }
      sqlite3ErrorWithMsg(db,uVar13,pcVar14,local_218);
      if (p != (char *)0x0) {
        sqlite3DbFreeNN(db,p);
      }
      sqlite3ParserReset(&local_1c8);
      if ((uVar13 == 0xc0a) || (db->mallocFailed != '\0')) {
        apiOomError(db);
        uVar13 = 7;
      }
      else {
        uVar13 = uVar13 & db->errMask;
      }
      if (db->mutex != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
      }
      return uVar13;
    }
    local_1c8.db = db;
    if (local_218 != (char *)0x0) {
      sqlite3DbFreeNN(db,local_218);
    }
    pcVar14 = local_1d0;
    local_218 = (char *)0x0;
    if (db->noSharedCache == '\0') {
      btreeEnterAll(db);
    }
    pTVar6 = sqlite3LocateTable(&local_1c8,0,pcVar14,local_1d8);
    if (pTVar6 == (Table *)0x0) {
      pTVar6 = (Table *)0x0;
    }
    else if (pTVar6->nModuleArg != 0) {
      sqlite3ErrorMsg(&local_1c8,"cannot open virtual table: %s",pcVar14);
      pTVar6 = (Table *)0x0;
    }
    if (pTVar6 == (Table *)0x0) {
LAB_001276ac:
      pTVar6 = (Table *)0x0;
    }
    else if ((pTVar6->tabFlags & 0x20) != 0) {
      sqlite3ErrorMsg(&local_1c8,"cannot open table without rowid: %s",pcVar14);
      goto LAB_001276ac;
    }
    if (pTVar6 == (Table *)0x0) {
LAB_001276d0:
      pTVar6 = (Table *)0x0;
    }
    else if (pTVar6->pSelect != (Select *)0x0) {
      sqlite3ErrorMsg(&local_1c8,"cannot open view: %s",pcVar14);
      goto LAB_001276d0;
    }
    if (pTVar6 == (Table *)0x0) {
      if (local_1c8.zErrMsg != (char *)0x0) {
        local_218 = local_1c8.zErrMsg;
        local_1c8.zErrMsg = (char *)0x0;
      }
LAB_00127a83:
      uVar13 = 1;
      if (db->noSharedCache == '\0') {
        btreeLeaveAll(db);
        uVar13 = 1;
      }
      goto LAB_00127a9d;
    }
    p_00->pTab = pTVar6;
    if (pTVar6->pSchema == (Schema *)0x0) {
      lVar10 = -1000000;
    }
    else {
      lVar10 = -0x100000000;
      ppSVar11 = &db->aDb->pSchema;
      do {
        lVar10 = lVar10 + 0x100000000;
        pSVar2 = *ppSVar11;
        ppSVar11 = ppSVar11 + 4;
      } while (pSVar2 != pTVar6->pSchema);
      lVar10 = lVar10 >> 0x20;
    }
    p_00->zDb = db->aDb[lVar10].zDbSName;
    uVar13 = (uint)pTVar6->nCol;
    local_210 = pTVar6;
    if (pTVar6->nCol < 1) {
      uVar15 = 0;
    }
    else {
      pCVar17 = pTVar6->aCol;
      uVar16 = 0;
      do {
        iVar4 = sqlite3StrICmp(pCVar17->zName,local_1f0);
        if (iVar4 == 0) goto LAB_00127760;
        uVar16 = uVar16 + 1;
        pCVar17 = pCVar17 + 1;
      } while (uVar13 != uVar16);
      uVar16 = (ulong)uVar13;
LAB_00127760:
      uVar15 = (uint)uVar16;
      db = local_200;
      p_00 = local_1f8;
    }
    if (uVar15 == uVar13) {
      local_218 = sqlite3MPrintf(db,"no such column: \"%s\"",local_1f0);
      goto LAB_00127a83;
    }
    if (local_208 != 0) {
      if ((db->flags & 0x4000) == 0) {
        pcVar14 = (char *)0x0;
      }
      else {
        pcVar14 = (char *)0x0;
        for (pFVar8 = local_210->pFKey; pFVar8 != (FKey *)0x0; pFVar8 = pFVar8->pNextFrom) {
          if (0 < (long)pFVar8->nCol) {
            lVar10 = 0;
            do {
              if (*(uint *)((long)&pFVar8->aCol[0].iFrom + lVar10) == uVar15) {
                pcVar14 = "foreign key";
              }
              lVar10 = lVar10 + 0x10;
            } while ((long)pFVar8->nCol * 0x10 != lVar10);
          }
        }
      }
      for (pIVar7 = local_210->pIndex; pIVar7 != (Index *)0x0; pIVar7 = pIVar7->pNext) {
        if ((ulong)pIVar7->nKeyCol != 0) {
          uVar16 = 0;
          do {
            if (uVar15 == (int)pIVar7->aiColumn[uVar16]) {
              pcVar14 = "indexed";
            }
            if ((int)pIVar7->aiColumn[uVar16] == 0xfffffffe) {
              pcVar14 = "indexed";
            }
            uVar16 = uVar16 + 1;
          } while (pIVar7->nKeyCol != uVar16);
        }
      }
      if (pcVar14 != (char *)0x0) {
        local_218 = sqlite3MPrintf(db,"cannot open %s column for writing",pcVar14);
        local_21c = 1;
        if (db->noSharedCache == '\0') {
          btreeLeaveAll(db);
          local_21c = 1;
        }
      }
      uVar13 = local_21c;
      if (pcVar14 != (char *)0x0) goto LAB_00127a9d;
    }
    p_01 = sqlite3VdbeCreate(&local_1c8);
    p_00->pStmt = (sqlite3_stmt *)p_01;
    if (p_01 != (Vdbe *)0x0) {
      pSVar2 = local_210->pSchema;
      if (pSVar2 == (Schema *)0x0) {
        iVar4 = -1000000;
      }
      else {
        iVar4 = -1;
        ppSVar11 = &db->aDb->pSchema;
        do {
          iVar4 = iVar4 + 1;
          pSVar3 = *ppSVar11;
          ppSVar11 = ppSVar11 + 4;
        } while (pSVar3 != pSVar2);
      }
      iVar1 = pSVar2->iGeneration;
      iVar5 = sqlite3VdbeAddOp3(p_01,2,iVar4,(uint)(wrFlag != 0),pSVar2->schema_cookie);
      psVar12 = p_01->db;
      if (psVar12->mallocFailed == '\0') {
        psVar12 = (sqlite3 *)p_01->aOp;
        *(undefined1 *)((long)psVar12->aLimit + (long)iVar5 * 0x18 + -0x7b) = 0xfd;
        psVar12->aLimit[(long)iVar5 * 6 + -0x1b] = iVar1;
      }
      if (0 < (long)p_01->nOp) {
        psVar12 = (sqlite3 *)p_01->aOp;
        *(undefined2 *)((long)psVar12 + ((long)p_01->nOp + -1) * 0x18 + 2) = 1;
      }
      pVVar9 = sqlite3VdbeAddOpList(p_01,6,sqlite3_blob_open::openBlob,(int)psVar12);
      db = local_200;
      uVar13 = 1 << ((byte)iVar4 & 0x1f);
      p_01->btreeMask = p_01->btreeMask | uVar13;
      if ((iVar4 != 1) && ((p_01->db->aDb[iVar4].pBt)->sharable != '\0')) {
        p_01->lockMask = p_01->lockMask | uVar13;
      }
      if (local_200->mallocFailed == '\0') {
        pVVar9->p1 = iVar4;
        pVVar9->p2 = local_210->tnum;
        pVVar9->p3 = (uint)(wrFlag != 0);
        local_1e8 = pVVar9;
        sqlite3VdbeChangeP4(p_01,2,local_210->zName,0);
        pVVar9 = local_1e8;
      }
      if (db->mallocFailed == '\0') {
        if (local_208 != 0) {
          pVVar9[1].opcode = 'n';
        }
        pVVar9[1].p2 = local_210->tnum;
        pVVar9[1].p3 = iVar4;
        pVVar9[1].p4type = -3;
        pVVar9[1].p4.i = local_210->nCol + 1;
        pVVar9[3].p2 = (int)local_210->nCol;
        local_1c8.nVar = 0;
        local_1c8.nTab = 1;
        local_1c8.nMem = 1;
        sqlite3VdbeMakeReady(p_01,&local_1c8);
      }
    }
    p_00 = local_1f8;
    local_1f8->iCol = (u16)uVar15;
    local_1f8->db = db;
    if (db->noSharedCache == '\0') {
      btreeLeaveAll(db);
    }
    uVar13 = local_21c;
    if ((db->mallocFailed != '\0') ||
       (uVar13 = blobSeekToRow(p_00,local_1e0,&local_218), 0x30 < local_204)) goto LAB_00127a9d;
    local_204 = local_204 + 1;
    local_21c = 0x11;
    if (uVar13 != 0x11) goto LAB_00127a9d;
  } while( true );
}

Assistant:

SQLITE_API int sqlite3_blob_open(
  sqlite3* db,            /* The database connection */
  const char *zDb,        /* The attached database containing the blob */
  const char *zTable,     /* The table containing the blob */
  const char *zColumn,    /* The column containing the blob */
  sqlite_int64 iRow,      /* The row containing the glob */
  int wrFlag,             /* True -> read/write access, false -> read-only */
  sqlite3_blob **ppBlob   /* Handle for accessing the blob returned here */
){
  int nAttempt = 0;
  int iCol;               /* Index of zColumn in row-record */
  int rc = SQLITE_OK;
  char *zErr = 0;
  Table *pTab;
  Incrblob *pBlob = 0;
  Parse sParse;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( ppBlob==0 ){
    return SQLITE_MISUSE_BKPT;
  }
#endif
  *ppBlob = 0;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) || zTable==0 ){
    return SQLITE_MISUSE_BKPT;
  }
#endif
  wrFlag = !!wrFlag;                /* wrFlag = (wrFlag ? 1 : 0); */

  sqlite3_mutex_enter(db->mutex);

  pBlob = (Incrblob *)sqlite3DbMallocZero(db, sizeof(Incrblob));
  do {
    memset(&sParse, 0, sizeof(Parse));
    if( !pBlob ) goto blob_open_out;
    sParse.db = db;
    sqlite3DbFree(db, zErr);
    zErr = 0;

    sqlite3BtreeEnterAll(db);
    pTab = sqlite3LocateTable(&sParse, 0, zTable, zDb);
    if( pTab && IsVirtual(pTab) ){
      pTab = 0;
      sqlite3ErrorMsg(&sParse, "cannot open virtual table: %s", zTable);
    }
    if( pTab && !HasRowid(pTab) ){
      pTab = 0;
      sqlite3ErrorMsg(&sParse, "cannot open table without rowid: %s", zTable);
    }
#ifndef SQLITE_OMIT_VIEW
    if( pTab && pTab->pSelect ){
      pTab = 0;
      sqlite3ErrorMsg(&sParse, "cannot open view: %s", zTable);
    }
#endif
    if( !pTab ){
      if( sParse.zErrMsg ){
        sqlite3DbFree(db, zErr);
        zErr = sParse.zErrMsg;
        sParse.zErrMsg = 0;
      }
      rc = SQLITE_ERROR;
      sqlite3BtreeLeaveAll(db);
      goto blob_open_out;
    }
    pBlob->pTab = pTab;
    pBlob->zDb = db->aDb[sqlite3SchemaToIndex(db, pTab->pSchema)].zDbSName;

    /* Now search pTab for the exact column. */
    for(iCol=0; iCol<pTab->nCol; iCol++) {
      if( sqlite3StrICmp(pTab->aCol[iCol].zName, zColumn)==0 ){
        break;
      }
    }
    if( iCol==pTab->nCol ){
      sqlite3DbFree(db, zErr);
      zErr = sqlite3MPrintf(db, "no such column: \"%s\"", zColumn);
      rc = SQLITE_ERROR;
      sqlite3BtreeLeaveAll(db);
      goto blob_open_out;
    }

    /* If the value is being opened for writing, check that the
    ** column is not indexed, and that it is not part of a foreign key. 
    */
    if( wrFlag ){
      const char *zFault = 0;
      Index *pIdx;
#ifndef SQLITE_OMIT_FOREIGN_KEY
      if( db->flags&SQLITE_ForeignKeys ){
        /* Check that the column is not part of an FK child key definition. It
        ** is not necessary to check if it is part of a parent key, as parent
        ** key columns must be indexed. The check below will pick up this 
        ** case.  */
        FKey *pFKey;
        for(pFKey=pTab->pFKey; pFKey; pFKey=pFKey->pNextFrom){
          int j;
          for(j=0; j<pFKey->nCol; j++){
            if( pFKey->aCol[j].iFrom==iCol ){
              zFault = "foreign key";
            }
          }
        }
      }
#endif
      for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
        int j;
        for(j=0; j<pIdx->nKeyCol; j++){
          /* FIXME: Be smarter about indexes that use expressions */
          if( pIdx->aiColumn[j]==iCol || pIdx->aiColumn[j]==XN_EXPR ){
            zFault = "indexed";
          }
        }
      }
      if( zFault ){
        sqlite3DbFree(db, zErr);
        zErr = sqlite3MPrintf(db, "cannot open %s column for writing", zFault);
        rc = SQLITE_ERROR;
        sqlite3BtreeLeaveAll(db);
        goto blob_open_out;
      }
    }

    pBlob->pStmt = (sqlite3_stmt *)sqlite3VdbeCreate(&sParse);
    assert( pBlob->pStmt || db->mallocFailed );
    if( pBlob->pStmt ){
      
      /* This VDBE program seeks a btree cursor to the identified 
      ** db/table/row entry. The reason for using a vdbe program instead
      ** of writing code to use the b-tree layer directly is that the
      ** vdbe program will take advantage of the various transaction,
      ** locking and error handling infrastructure built into the vdbe.
      **
      ** After seeking the cursor, the vdbe executes an OP_ResultRow.
      ** Code external to the Vdbe then "borrows" the b-tree cursor and
      ** uses it to implement the blob_read(), blob_write() and 
      ** blob_bytes() functions.
      **
      ** The sqlite3_blob_close() function finalizes the vdbe program,
      ** which closes the b-tree cursor and (possibly) commits the 
      ** transaction.
      */
      static const int iLn = VDBE_OFFSET_LINENO(2);
      static const VdbeOpList openBlob[] = {
        {OP_TableLock,      0, 0, 0},  /* 0: Acquire a read or write lock */
        {OP_OpenRead,       0, 0, 0},  /* 1: Open a cursor */
        /* blobSeekToRow() will initialize r[1] to the desired rowid */
        {OP_NotExists,      0, 5, 1},  /* 2: Seek the cursor to rowid=r[1] */
        {OP_Column,         0, 0, 1},  /* 3  */
        {OP_ResultRow,      1, 0, 0},  /* 4  */
        {OP_Halt,           0, 0, 0},  /* 5  */
      };
      Vdbe *v = (Vdbe *)pBlob->pStmt;
      int iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
      VdbeOp *aOp;

      sqlite3VdbeAddOp4Int(v, OP_Transaction, iDb, wrFlag, 
                           pTab->pSchema->schema_cookie,
                           pTab->pSchema->iGeneration);
      sqlite3VdbeChangeP5(v, 1);
      assert( sqlite3VdbeCurrentAddr(v)==2 || db->mallocFailed );
      aOp = sqlite3VdbeAddOpList(v, ArraySize(openBlob), openBlob, iLn);

      /* Make sure a mutex is held on the table to be accessed */
      sqlite3VdbeUsesBtree(v, iDb); 

      if( db->mallocFailed==0 ){
        assert( aOp!=0 );
        /* Configure the OP_TableLock instruction */
#ifdef SQLITE_OMIT_SHARED_CACHE
        aOp[0].opcode = OP_Noop;
#else
        aOp[0].p1 = iDb;
        aOp[0].p2 = pTab->tnum;
        aOp[0].p3 = wrFlag;
        sqlite3VdbeChangeP4(v, 2, pTab->zName, P4_TRANSIENT);
      }
      if( db->mallocFailed==0 ){
#endif

        /* Remove either the OP_OpenWrite or OpenRead. Set the P2 
        ** parameter of the other to pTab->tnum.  */
        if( wrFlag ) aOp[1].opcode = OP_OpenWrite;
        aOp[1].p2 = pTab->tnum;
        aOp[1].p3 = iDb;   

        /* Configure the number of columns. Configure the cursor to
        ** think that the table has one more column than it really
        ** does. An OP_Column to retrieve this imaginary column will
        ** always return an SQL NULL. This is useful because it means
        ** we can invoke OP_Column to fill in the vdbe cursors type 
        ** and offset cache without causing any IO.
        */
        aOp[1].p4type = P4_INT32;
        aOp[1].p4.i = pTab->nCol+1;
        aOp[3].p2 = pTab->nCol;

        sParse.nVar = 0;
        sParse.nMem = 1;
        sParse.nTab = 1;
        sqlite3VdbeMakeReady(v, &sParse);
      }
    }
   
    pBlob->iCol = iCol;
    pBlob->db = db;
    sqlite3BtreeLeaveAll(db);
    if( db->mallocFailed ){
      goto blob_open_out;
    }
    rc = blobSeekToRow(pBlob, iRow, &zErr);
  } while( (++nAttempt)<SQLITE_MAX_SCHEMA_RETRY && rc==SQLITE_SCHEMA );

blob_open_out:
  if( rc==SQLITE_OK && db->mallocFailed==0 ){
    *ppBlob = (sqlite3_blob *)pBlob;
  }else{
    if( pBlob && pBlob->pStmt ) sqlite3VdbeFinalize((Vdbe *)pBlob->pStmt);
    sqlite3DbFree(db, pBlob);
  }
  sqlite3ErrorWithMsg(db, rc, (zErr ? "%s" : 0), zErr);
  sqlite3DbFree(db, zErr);
  sqlite3ParserReset(&sParse);
  rc = sqlite3ApiExit(db, rc);
  sqlite3_mutex_leave(db->mutex);
  return rc;
}